

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O2

void __thiscall ObjectStore::~ObjectStore(ObjectStore *this)

{
  MutexFactory *this_00;
  pointer ppOVar1;
  MutexLocker lock;
  MutexLocker local_30;
  
  this->_vptr_ObjectStore = (_func_int **)&PTR__ObjectStore_0019eb10;
  MutexLocker::MutexLocker(&local_30,this->storeMutex);
  ppOVar1 = (this->tokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar1) {
    (this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppOVar1;
  }
  for (ppOVar1 = (this->allTokens).
                 super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppOVar1 !=
      (this->allTokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppOVar1 = ppOVar1 + 1) {
    if (*ppOVar1 != (ObjectStoreToken *)0x0) {
      (*(*ppOVar1)->_vptr_ObjectStoreToken[0xd])();
    }
  }
  MutexLocker::~MutexLocker(&local_30);
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->storeMutex);
  std::__cxx11::string::~string((string *)&this->storePath);
  std::_Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::~_Vector_base
            (&(this->allTokens).
              super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>);
  std::_Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::~_Vector_base
            (&(this->tokens).
              super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>);
  return;
}

Assistant:

ObjectStore::~ObjectStore()
{
	{
		MutexLocker lock(storeMutex);

		// Clean up
		tokens.clear();

		for (std::vector<ObjectStoreToken*>::iterator i = allTokens.begin(); i != allTokens.end(); i++)
		{
			delete *i;
		}
	}

	MutexFactory::i()->recycleMutex(storeMutex);
}